

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::OrderRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,OrderRelation *this,idx_t depth)

{
  reference pvVar1;
  pointer pPVar2;
  Relation *pRVar3;
  char *__rhs;
  ulong __n;
  string str;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_90,(Relation *)depth,depth);
  ::std::operator+(&local_70,&local_90,"Order [");
  ::std::__cxx11::string::~string((string *)&local_90);
  for (__n = 0; __n < (ulong)((long)(this->orders).
                                    super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                    .
                                    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->orders).
                                    super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                    .
                                    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)&local_70);
    }
    pvVar1 = vector<duckdb::OrderByNode,_true>::get<true>(&this->orders,__n);
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&pvVar1->expression);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar2);
    pvVar1 = vector<duckdb::OrderByNode,_true>::get<true>(&this->orders,__n);
    __rhs = " DESC";
    if (pvVar1->type == ASCENDING) {
      __rhs = " ASC";
    }
    ::std::operator+(&local_90,&local_50,__rhs);
    ::std::__cxx11::string::append((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::append((char *)&local_70);
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar3->_vptr_Relation[6])(&local_90,pRVar3,depth + 1);
  ::std::operator+(__return_storage_ptr__,&local_70,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string OrderRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Order [";
	for (idx_t i = 0; i < orders.size(); i++) {
		if (i != 0) {
			str += ", ";
		}
		str += orders[i].expression->ToString() + (orders[i].type == OrderType::ASCENDING ? " ASC" : " DESC");
	}
	str += "]\n";
	return str + child->ToString(depth + 1);
}